

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-active.c
# Opt level: O0

int run_test_active(void)

{
  int iVar1;
  uv_loop_t *puVar2;
  int64_t eval_b_16;
  int64_t eval_a_16;
  int64_t eval_b_15;
  int64_t eval_a_15;
  int64_t eval_b_14;
  int64_t eval_a_14;
  int64_t eval_b_13;
  int64_t eval_a_13;
  int64_t eval_b_12;
  int64_t eval_a_12;
  int64_t eval_b_11;
  int64_t eval_a_11;
  int64_t eval_b_10;
  int64_t eval_a_10;
  int64_t eval_b_9;
  int64_t eval_a_9;
  int64_t eval_b_8;
  int64_t eval_a_8;
  int64_t eval_b_7;
  int64_t eval_a_7;
  int64_t eval_b_6;
  int64_t eval_a_6;
  int64_t eval_b_5;
  int64_t eval_a_5;
  int64_t eval_b_4;
  int64_t eval_a_4;
  int64_t eval_b_3;
  int64_t eval_a_3;
  int64_t eval_b_2;
  int64_t eval_a_2;
  int64_t eval_b_1;
  int64_t eval_a_1;
  int64_t eval_b;
  int64_t eval_a;
  uv_timer_t timer;
  int r;
  
  puVar2 = uv_default_loop();
  timer.start_id._4_4_ = uv_timer_init(puVar2,(uv_timer_t *)&eval_a);
  if ((long)timer.start_id._4_4_ != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-active.c"
            ,0x30,"r","==","0",(long)timer.start_id._4_4_,"==",0);
    abort();
  }
  iVar1 = uv_is_active((uv_handle_t *)&eval_a);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-active.c"
            ,0x33,"uv_is_active((uv_handle_t*) &timer)","==","0",(long)iVar1,"==",0);
    abort();
  }
  iVar1 = uv_is_closing((uv_handle_t *)&eval_a);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-active.c"
            ,0x34,"uv_is_closing((uv_handle_t*) &timer)","==","0",(long)iVar1,"==",0);
    abort();
  }
  timer.start_id._4_4_ = uv_timer_start((uv_timer_t *)&eval_a,timer_cb,1000,0);
  if ((long)timer.start_id._4_4_ != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-active.c"
            ,0x37,"r","==","0",(long)timer.start_id._4_4_,"==",0);
    abort();
  }
  iVar1 = uv_is_active((uv_handle_t *)&eval_a);
  if ((long)iVar1 != 1) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-active.c"
            ,0x39,"1","==","uv_is_active((uv_handle_t*) &timer)",1,"==",(long)iVar1);
    abort();
  }
  iVar1 = uv_is_closing((uv_handle_t *)&eval_a);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-active.c"
            ,0x3a,"uv_is_closing((uv_handle_t*) &timer)","==","0",(long)iVar1,"==",0);
    abort();
  }
  timer.start_id._4_4_ = uv_timer_stop((uv_timer_t *)&eval_a);
  if ((long)timer.start_id._4_4_ != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-active.c"
            ,0x3d,"r","==","0",(long)timer.start_id._4_4_,"==",0);
    abort();
  }
  iVar1 = uv_is_active((uv_handle_t *)&eval_a);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-active.c"
            ,0x3f,"uv_is_active((uv_handle_t*) &timer)","==","0",(long)iVar1,"==",0);
    abort();
  }
  iVar1 = uv_is_closing((uv_handle_t *)&eval_a);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-active.c"
            ,0x40,"uv_is_closing((uv_handle_t*) &timer)","==","0",(long)iVar1,"==",0);
    abort();
  }
  timer.start_id._4_4_ = uv_timer_start((uv_timer_t *)&eval_a,timer_cb,1000,0);
  if ((long)timer.start_id._4_4_ != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-active.c"
            ,0x43,"r","==","0",(long)timer.start_id._4_4_,"==",0);
    abort();
  }
  iVar1 = uv_is_active((uv_handle_t *)&eval_a);
  if ((long)iVar1 != 1) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-active.c"
            ,0x45,"1","==","uv_is_active((uv_handle_t*) &timer)",1,"==",(long)iVar1);
    abort();
  }
  iVar1 = uv_is_closing((uv_handle_t *)&eval_a);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-active.c"
            ,0x46,"uv_is_closing((uv_handle_t*) &timer)","==","0",(long)iVar1,"==",0);
    abort();
  }
  uv_close((uv_handle_t *)&eval_a,close_cb);
  iVar1 = uv_is_active((uv_handle_t *)&eval_a);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-active.c"
            ,0x4a,"uv_is_active((uv_handle_t*) &timer)","==","0",(long)iVar1,"==",0);
    abort();
  }
  iVar1 = uv_is_closing((uv_handle_t *)&eval_a);
  if ((long)iVar1 != 1) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-active.c"
            ,0x4b,"1","==","uv_is_closing((uv_handle_t*) &timer)",1,"==",(long)iVar1);
    abort();
  }
  puVar2 = uv_default_loop();
  timer.start_id._4_4_ = uv_run(puVar2,UV_RUN_DEFAULT);
  if ((long)timer.start_id._4_4_ != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-active.c"
            ,0x4e,"r","==","0",(long)timer.start_id._4_4_,"==",0);
    abort();
  }
  if ((long)close_cb_called != 1) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-active.c"
            ,0x50,"1","==","close_cb_called",1,"==",(long)close_cb_called);
    abort();
  }
  puVar2 = uv_default_loop();
  close_loop(puVar2);
  puVar2 = uv_default_loop();
  iVar1 = uv_loop_close(puVar2);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-active.c"
            ,0x52,"0","==","uv_loop_close(uv_default_loop())",0,"==",(long)iVar1);
    abort();
  }
  uv_library_shutdown();
  return 0;
}

Assistant:

TEST_IMPL(active) {
  int r;
  uv_timer_t timer;

  r = uv_timer_init(uv_default_loop(), &timer);
  ASSERT_OK(r);

  /* uv_is_active() and uv_is_closing() should always return either 0 or 1. */
  ASSERT_OK(uv_is_active((uv_handle_t*) &timer));
  ASSERT_OK(uv_is_closing((uv_handle_t*) &timer));

  r = uv_timer_start(&timer, timer_cb, 1000, 0);
  ASSERT_OK(r);

  ASSERT_EQ(1, uv_is_active((uv_handle_t*) &timer));
  ASSERT_OK(uv_is_closing((uv_handle_t*) &timer));

  r = uv_timer_stop(&timer);
  ASSERT_OK(r);

  ASSERT_OK(uv_is_active((uv_handle_t*) &timer));
  ASSERT_OK(uv_is_closing((uv_handle_t*) &timer));

  r = uv_timer_start(&timer, timer_cb, 1000, 0);
  ASSERT_OK(r);

  ASSERT_EQ(1, uv_is_active((uv_handle_t*) &timer));
  ASSERT_OK(uv_is_closing((uv_handle_t*) &timer));

  uv_close((uv_handle_t*) &timer, close_cb);

  ASSERT_OK(uv_is_active((uv_handle_t*) &timer));
  ASSERT_EQ(1, uv_is_closing((uv_handle_t*) &timer));

  r = uv_run(uv_default_loop(), UV_RUN_DEFAULT);
  ASSERT_OK(r);

  ASSERT_EQ(1, close_cb_called);

  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}